

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatOrderH.c
# Opt level: O3

int Msat_HeapCheck_rec(Msat_Order_t *p,int i)

{
  double dVar1;
  int iVar2;
  Msat_IntVec_t *pMVar3;
  double *pdVar4;
  int *piVar5;
  int iVar6;
  
  pMVar3 = p->vHeap;
  iVar2 = pMVar3->nSize;
  if (i < iVar2) {
    do {
      if ((1 < (uint)i) &&
         (pdVar4 = p->pSat->pdActivity, piVar5 = pMVar3->pArray, dVar1 = pdVar4[piVar5[i]],
         pdVar4 = pdVar4 + piVar5[i >> 1], *pdVar4 <= dVar1 && dVar1 != *pdVar4)) {
        return 0;
      }
      iVar6 = Msat_HeapCheck_rec(p,i * 2);
      if (iVar6 == 0) {
        return 0;
      }
      i = i * 2 | 1;
    } while (i < iVar2);
  }
  return 1;
}

Assistant:

int Msat_HeapCheck_rec( Msat_Order_t * p, int i )
{
    return i >= HSIZE(p) ||
        (
            ( HPARENT(i) == 0 || !HCOMPARE(p, HHEAP(p, i), HHEAP(p, HPARENT(i))) ) &&

            Msat_HeapCheck_rec( p, HLEFT(i) ) && 
            
            Msat_HeapCheck_rec( p, HRIGHT(i) )
        );
}